

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O2

duckdb_state
duckdb_bind_parameter_index
          (duckdb_prepared_statement prepared_statement,idx_t *param_idx_out,char *name_p)

{
  bool bVar1;
  pointer pPVar2;
  duckdb_state dVar3;
  __node_base *p_Var4;
  allocator local_41;
  string name;
  
  dVar3 = DuckDBError;
  if ((prepared_statement != (duckdb_prepared_statement)0x0) &&
     (*(long *)(prepared_statement + 0x38) != 0)) {
    pPVar2 = duckdb::
             unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
             ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                           *)(prepared_statement + 0x38));
    bVar1 = duckdb::PreparedStatement::HasError(pPVar2);
    if ((!bVar1) && (param_idx_out != (idx_t *)0x0 && name_p != (char *)0x0)) {
      std::__cxx11::string::string((string *)&name,name_p,&local_41);
      pPVar2 = duckdb::
               unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
               ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                             *)(prepared_statement + 0x38));
      p_Var4 = &(pPVar2->named_param_map)._M_h._M_before_begin;
      do {
        p_Var4 = p_Var4->_M_nxt;
        if (p_Var4 == (__node_base *)0x0) goto LAB_01a35d8d;
        bVar1 = duckdb::StringUtil::CIEquals((string *)(p_Var4 + 1),&name);
      } while (!bVar1);
      *param_idx_out = (idx_t)p_Var4[5]._M_nxt;
LAB_01a35d8d:
      dVar3 = (duckdb_state)(p_Var4 == (__node_base *)0x0);
      std::__cxx11::string::~string((string *)&name);
    }
  }
  return dVar3;
}

Assistant:

duckdb_state duckdb_bind_parameter_index(duckdb_prepared_statement prepared_statement, idx_t *param_idx_out,
                                         const char *name_p) {
	auto wrapper = (PreparedStatementWrapper *)prepared_statement;
	if (!wrapper || !wrapper->statement || wrapper->statement->HasError()) {
		return DuckDBError;
	}
	if (!name_p || !param_idx_out) {
		return DuckDBError;
	}
	auto name = std::string(name_p);
	for (auto &pair : wrapper->statement->named_param_map) {
		if (duckdb::StringUtil::CIEquals(pair.first, name)) {
			*param_idx_out = pair.second;
			return DuckDBSuccess;
		}
	}
	return DuckDBError;
}